

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<137UL,_GF2::MOGrlex<137UL>_>::SymDiff
          (MP<137UL,_GF2::MOGrlex<137UL>_> *this,MP<137UL,_GF2::MOGrlex<137UL>_> *polyRight)

{
  const_iterator __position;
  const_iterator __position_00;
  bool bVar1;
  reference m1;
  long in_RSI;
  long in_RDI;
  int cmp;
  const_iterator iterRight;
  iterator iter;
  MM<137UL> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar2;
  value_type *in_stack_ffffffffffffff78;
  list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  iterator local_70;
  _List_const_iterator<GF2::MM<137UL>_> local_68;
  _Self local_60;
  _List_const_iterator<GF2::MM<137UL>_> local_58;
  iterator in_stack_ffffffffffffffb0;
  _List_const_iterator<GF2::MM<137UL>_> in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  _Self local_18 [3];
  
  if (in_RDI == in_RSI) {
    SetEmpty((MP<137UL,_GF2::MOGrlex<137UL>_> *)0x1b3338);
  }
  else {
    local_18[0]._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::begin
                   ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)
                    in_stack_ffffffffffffff58);
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::begin
                   ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)
                    in_stack_ffffffffffffff58);
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::end
                     ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)
                      in_stack_ffffffffffffff58);
      bVar1 = std::operator!=(local_18,&local_28);
      uVar2 = false;
      if (bVar1) {
        local_30._M_node =
             (_List_node_base *)
             std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::end
                       ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)
                        in_stack_ffffffffffffff58);
        uVar2 = std::operator!=(&local_20,&local_30);
      }
      if ((bool)uVar2 == false) break;
      in_stack_ffffffffffffff58 = (MM<137UL> *)(in_RDI + 0x18);
      m1 = std::_List_iterator<GF2::MM<137UL>_>::operator*
                     ((_List_iterator<GF2::MM<137UL>_> *)0x1b33e9);
      std::_List_const_iterator<GF2::MM<137UL>_>::operator*
                ((_List_const_iterator<GF2::MM<137UL>_> *)m1);
      in_stack_ffffffffffffffcc =
           MOGrlex<137UL>::Compare
                     ((MOGrlex<137UL> *)CONCAT17(uVar2,in_stack_ffffffffffffff68),m1,
                      in_stack_ffffffffffffff58);
      if (in_stack_ffffffffffffffcc < 1) {
        if (in_stack_ffffffffffffffcc < 0) {
          std::_List_const_iterator<GF2::MM<137UL>_>::_List_const_iterator
                    ((_List_const_iterator<GF2::MM<137UL>_> *)&stack0xffffffffffffffb8,local_18);
          std::_List_const_iterator<GF2::MM<137UL>_>::operator*
                    ((_List_const_iterator<GF2::MM<137UL>_> *)m1);
          in_stack_ffffffffffffffc0 =
               std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::insert
                         (in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff78);
          local_18[0]._M_node = in_stack_ffffffffffffffc0._M_node;
        }
        else {
          std::_List_const_iterator<GF2::MM<137UL>_>::_List_const_iterator(&local_58,local_18);
          __position._M_node._7_1_ = uVar2;
          __position._M_node._0_7_ = in_stack_ffffffffffffff68;
          in_stack_ffffffffffffffb0 =
               std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::erase
                         ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)m1,__position);
          local_18[0]._M_node = in_stack_ffffffffffffffb0._M_node;
        }
        std::_List_const_iterator<GF2::MM<137UL>_>::operator++(&local_20);
      }
      else {
        std::_List_iterator<GF2::MM<137UL>_>::operator++(local_18);
      }
    }
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::end
                   ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)
                    in_stack_ffffffffffffff58);
    bVar1 = std::operator==(local_18,&local_60);
    if (bVar1) {
      local_70._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::end
                     ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)
                      in_stack_ffffffffffffff58);
      std::_List_const_iterator<GF2::MM<137UL>_>::_List_const_iterator(&local_68,&local_70);
      std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::end
                ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)in_stack_ffffffffffffff58
                );
      __position_00._M_node._4_4_ = in_stack_ffffffffffffffcc;
      __position_00._M_node._0_4_ = in_stack_ffffffffffffffc8;
      std::__cxx11::list<GF2::MM<137ul>,std::allocator<GF2::MM<137ul>>>::
      insert<std::_List_const_iterator<GF2::MM<137ul>>,void>
                ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)
                 in_stack_ffffffffffffffb0._M_node,__position_00,
                 (_List_const_iterator<GF2::MM<137UL>_>)in_stack_ffffffffffffffc0._M_node,
                 in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void SymDiff(const MP& polyRight)
	{	
		assert(IsConsistent(polyRight));
		// к самому себе?
		if (this == &polyRight)
		{
			SetEmpty();
			return;
		}
		iterator iter = begin();
		const_iterator iterRight = polyRight.begin();
		while (iter != end() && iterRight != polyRight.end())
		{
			int cmp = _order.Compare(*iter, *iterRight);
			if (cmp > 0) ++iter;
			else 
			{
				// вставить новый моном
				if (cmp < 0) iter = insert(iter, *iterRight);
				// исключить повтор
				else iter = erase(iter);
				// к следующему 
				++iterRight;
			}
		}
		// добавить остаток polyRight
		if (iter == end())
			insert(end(), iterRight, polyRight.end());
	}